

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger default_delegate_tointeger(HSQUIRRELVM v)

{
  SQObjectType SVar1;
  bool bVar2;
  SQObjectPtr *pSVar3;
  SQInteger SVar4;
  SQRESULT SVar5;
  SQObjectPtr res;
  SQInteger base;
  SQObjectPtr local_28;
  
  pSVar3 = stack_get(v,1);
  base = 10;
  SVar4 = sq_gettop(v);
  if (1 < SVar4) {
    sq_getinteger(v,2,&base);
  }
  SVar1 = (pSVar3->super_SQObject)._type;
  if (SVar1 == OT_BOOL) {
    res.super_SQObject._unVal.nInteger._1_7_ = 0;
    res.super_SQObject._unVal.nInteger._0_1_ =
         (pSVar3->super_SQObject)._unVal.pTable != (SQTable *)0x0;
    res.super_SQObject._type = OT_INTEGER;
    SQVM::Push(v,&res);
  }
  else if ((SVar1 == OT_INTEGER) || (SVar1 == OT_FLOAT)) {
    if (SVar1 == OT_FLOAT) {
      res.super_SQObject._unVal.nInteger = (SQInteger)(pSVar3->super_SQObject)._unVal.fFloat;
    }
    else {
      res.super_SQObject._unVal = (pSVar3->super_SQObject)._unVal;
    }
    res.super_SQObject._type = OT_INTEGER;
    SQVM::Push(v,&res);
  }
  else {
    if (SVar1 != OT_STRING) {
      SQVM::PushNull(v);
      return 1;
    }
    res.super_SQObject._type = OT_NULL;
    res.super_SQObject._unVal.pTable = (SQTable *)0x0;
    bVar2 = str2num(((pSVar3->super_SQObject)._unVal.pString)->_val,&res,base);
    if (!bVar2) {
      SQObjectPtr::~SQObjectPtr(&res);
      SVar5 = sq_throwerror(v,"cannot convert the string");
      return SVar5;
    }
    local_28.super_SQObject._unVal = res.super_SQObject._unVal;
    if (res.super_SQObject._type == OT_FLOAT) {
      local_28.super_SQObject._unVal.nInteger = (long)res.super_SQObject._unVal.fFloat;
    }
    local_28.super_SQObject._type = OT_INTEGER;
    SQVM::Push(v,&local_28);
    SQObjectPtr::~SQObjectPtr(&local_28);
  }
  SQObjectPtr::~SQObjectPtr(&res);
  return 1;
}

Assistant:

static SQInteger default_delegate_tointeger(HSQUIRRELVM v)
{
    SQObjectPtr &o=stack_get(v,1);
    SQInteger base = 10;
    if(sq_gettop(v) > 1) {
        sq_getinteger(v,2,&base);
    }
    switch(type(o)){
    case OT_STRING:{
        SQObjectPtr res;
        if(str2num(_stringval(o),res,base)){
            v->Push(SQObjectPtr(tointeger(res)));
            break;
        }}
        return sq_throwerror(v, _SC("cannot convert the string"));
        break;
    case OT_INTEGER:case OT_FLOAT:
        v->Push(SQObjectPtr(tointeger(o)));
        break;
    case OT_BOOL:
        v->Push(SQObjectPtr(_integer(o)?(SQInteger)1:(SQInteger)0));
        break;
    default:
        v->PushNull();
        break;
    }
    return 1;
}